

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx *dctx,ZSTD_dParameter dParam,int value)

{
  int iVar1;
  int iVar2;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  switch(dParam) {
  case ZSTD_d_experimentalParam1:
    iVar2 = ZSTD_dParam_withinBounds(ZSTD_d_experimentalParam1,value);
    if (iVar2 == 0) {
      return 0xffffffffffffffd6;
    }
    dctx->format = value;
    break;
  case ZSTD_d_experimentalParam2:
    iVar2 = ZSTD_dParam_withinBounds(ZSTD_d_experimentalParam2,value);
    if (iVar2 == 0) {
      return 0xffffffffffffffd6;
    }
    dctx->outBufferMode = value;
    break;
  case ZSTD_d_experimentalParam3:
    iVar2 = ZSTD_dParam_withinBounds(ZSTD_d_experimentalParam3,value);
    if (iVar2 == 0) {
      return 0xffffffffffffffd6;
    }
    dctx->forceIgnoreChecksum = value;
    break;
  case ZSTD_d_experimentalParam4:
    iVar2 = ZSTD_dParam_withinBounds(ZSTD_d_experimentalParam4,value);
    if (iVar2 == 0) {
      return 0xffffffffffffffd6;
    }
    if (dctx->staticSize != 0) {
      return 0xffffffffffffffd8;
    }
    dctx->refMultipleDDicts = value;
    break;
  default:
    if (dParam != ZSTD_d_windowLogMax) {
      return 0xffffffffffffffd8;
    }
    iVar2 = 0x1b;
    if (value != 0) {
      iVar2 = value;
    }
    iVar1 = ZSTD_dParam_withinBounds(ZSTD_d_windowLogMax,iVar2);
    if (iVar1 == 0) {
      return 0xffffffffffffffd6;
    }
    dctx->maxWindowSize = 1L << ((byte)iVar2 & 0x3f);
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx* dctx, ZSTD_dParameter dParam, int value)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            if (value == 0) value = ZSTD_WINDOWLOG_LIMIT_DEFAULT;
            CHECK_DBOUNDS(ZSTD_d_windowLogMax, value);
            dctx->maxWindowSize = ((size_t)1) << value;
            return 0;
        case ZSTD_d_format:
            CHECK_DBOUNDS(ZSTD_d_format, value);
            dctx->format = (ZSTD_format_e)value;
            return 0;
        case ZSTD_d_stableOutBuffer:
            CHECK_DBOUNDS(ZSTD_d_stableOutBuffer, value);
            dctx->outBufferMode = (ZSTD_bufferMode_e)value;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            CHECK_DBOUNDS(ZSTD_d_forceIgnoreChecksum, value);
            dctx->forceIgnoreChecksum = (ZSTD_forceIgnoreChecksum_e)value;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            CHECK_DBOUNDS(ZSTD_d_refMultipleDDicts, value);
            if (dctx->staticSize != 0) {
                RETURN_ERROR(parameter_unsupported, "Static dctx does not support multiple DDicts!");
            }
            dctx->refMultipleDDicts = (ZSTD_refMultipleDDicts_e)value;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}